

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus_settings.cpp
# Opt level: O2

void __thiscall CMenus::RenderThemeSelection(CMenus *this,CUIRect MainView,bool Header)

{
  sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *this_00;
  long lVar1;
  CConfig *pCVar2;
  IStorage *pIVar3;
  IGraphics *pIVar4;
  CGameClient *pCVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  CTheme *pId;
  CUIRect *pRect;
  long lVar9;
  int i;
  long lVar10;
  long in_FS_OFFSET;
  float HeaderHeight;
  CUIRect Icon;
  CListboxItem Item;
  range r;
  bool IsActive;
  CUIRect MainView_local;
  char aName [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MainView_local = MainView;
  if ((RenderThemeSelection(CUIRect,bool)::s_ListBox == '\0') &&
     (iVar7 = __cxa_guard_acquire(&RenderThemeSelection(CUIRect,bool)::s_ListBox), iVar7 != 0)) {
    CListBox::CListBox(&RenderThemeSelection::s_ListBox);
    __cxa_atexit(CListBox::~CListBox,&RenderThemeSelection::s_ListBox,&__dso_handle);
    __cxa_guard_release(&RenderThemeSelection(CUIRect,bool)::s_ListBox);
  }
  this_00 = &this->m_lThemes;
  if ((this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.num_elements
      == 0) {
    pCVar2 = ((this->super_CComponent).m_pClient)->m_pConfig;
    if (pCVar2->m_ClShowMenuMap == 0) {
      str_copy(pCVar2->m_ClMenuMap,"",0x40);
    }
    CTheme::CTheme((CTheme *)aName,"",false,false);
    sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::add(this_00,(CTheme *)aName);
    string_base<allocator_default<char>_>::~string_base
              ((string_base<allocator_default<char>_> *)aName);
    CTheme::CTheme((CTheme *)aName,"auto",false,false);
    sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::add(this_00,(CTheme *)aName);
    string_base<allocator_default<char>_>::~string_base
              ((string_base<allocator_default<char>_> *)aName);
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pStorage;
    (*(pIVar3->super_IInterface)._vptr_IInterface[2])(pIVar3,0xffffffff,"ui/themes",ThemeScan,this);
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pStorage;
    (*(pIVar3->super_IInterface)._vptr_IInterface[2])
              (pIVar3,0xffffffff,"ui/themes",ThemeIconScan,this);
  }
  lVar9 = 0;
  iVar7 = -1;
  for (lVar10 = 0;
      lVar10 < (this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.
               num_elements; lVar10 = lVar10 + 1) {
    iVar6 = str_comp(*(char **)((long)&(((this->m_lThemes).
                                         super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>
                                        .list)->m_Name).str + lVar9),
                     ((this->super_CComponent).m_pClient)->m_pConfig->m_ClMenuMap);
    if (iVar6 == 0) {
      iVar7 = (int)lVar10;
      break;
    }
    lVar9 = lVar9 + 0x18;
  }
  if (Header) {
    pcVar8 = Localize("Theme","");
    HeaderHeight = CUI::GetListHeaderHeight(&((this->super_CComponent).m_pClient)->m_UI);
    CListBox::DoHeader(&RenderThemeSelection::s_ListBox,&MainView_local,pcVar8,HeaderHeight,2.0);
    pRect = (CUIRect *)0x0;
  }
  else {
    pRect = &MainView_local;
  }
  IsActive = this->m_ActiveListBox == 2;
  CListBox::DoStart(&RenderThemeSelection::s_ListBox,20.0,
                    (this->m_lThemes).
                    super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.num_elements,1,3
                    ,iVar7,pRect,Header,&IsActive,0xf);
  r.super_plain_range<CMenus::CTheme>.begin =
       (this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.list;
  r.super_plain_range<CMenus::CTheme>.end =
       r.super_plain_range<CMenus::CTheme>.begin +
       (this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.
       num_elements;
  do {
    if (r.super_plain_range<CMenus::CTheme>.end <= r.super_plain_range<CMenus::CTheme>.begin) {
      iVar6 = CListBox::DoEnd(&RenderThemeSelection::s_ListBox);
      if (iVar7 != iVar6) {
        this->m_ActiveListBox = 2;
        str_copy(((this->super_CComponent).m_pClient)->m_pConfig->m_ClMenuMap,
                 (this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.
                 list[iVar6].m_Name.str,0x40);
        pCVar5 = (this->super_CComponent).m_pClient;
        pCVar5->m_pConfig->m_ClShowMenuMap =
             (uint)(*(this->m_lThemes).
                     super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.list[iVar6].
                     m_Name.str != '\0');
        CMapLayers::BackgroundMapUpdate(pCVar5->m_pMapLayersBackGround);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    pId = plain_range<CMenus::CTheme>::front(&r.super_plain_range<CMenus::CTheme>);
    CListBox::DoNextItem
              (&Item,&RenderThemeSelection::s_ListBox,pId,
               ((long)pId -
               (long)(this_00->super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>).list
               ) / 0x18 == (long)iVar7,&IsActive);
    if (IsActive == true) {
      this->m_ActiveListBox = 2;
    }
    if (Item.m_Visible == true) {
      CUIRect::VSplitLeft(&Item.m_Rect,Item.m_Rect.h + Item.m_Rect.h,&Icon,&Item.m_Rect);
      if (-1 < (pId->m_IconTexture).m_Id) {
        CUIRect::VMargin(&Icon,6.0,&Icon);
        CUIRect::HMargin(&Icon,3.0,&Icon);
        pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        (*(pIVar4->super_IInterface)._vptr_IInterface[0x13])
                  (pIVar4,(ulong)(uint)(pId->m_IconTexture).m_Id);
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
          [0x17])();
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
          [0x21])(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
        aName._0_4_ = Icon.x;
        aName._4_4_ = Icon.y;
        aName._8_4_ = Icon.w;
        aName._12_4_ = Icon.h;
        pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        (*(pIVar4->super_IInterface)._vptr_IInterface[0x1d])(pIVar4,aName,1);
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
          [0x18])();
      }
      pcVar8 = (pId->m_Name).str;
      if (*pcVar8 == '\0') {
        pcVar8 = "(none)";
LAB_0015fe08:
        str_copy(aName,pcVar8,0x80);
      }
      else {
        iVar6 = str_comp(pcVar8,"auto");
        if (iVar6 == 0) {
          pcVar8 = "(automatic)";
          goto LAB_0015fe08;
        }
        if (pId->m_HasDay == true) {
          if (pId->m_HasNight == false) {
            pcVar8 = "%s (day)";
          }
          else {
LAB_0015fe3d:
            pcVar8 = "%s";
          }
        }
        else {
          if (pId->m_HasNight == false) goto LAB_0015fe3d;
          pcVar8 = "%s (night)";
        }
        str_format(aName,0x80,pcVar8,(pId->m_Name).str);
      }
      CUI::DoLabelSelected
                (&((this->super_CComponent).m_pClient)->m_UI,&Item.m_Rect,aName,Item.m_Selected,
                 Item.m_Rect.h * 0.8 * 0.8,4);
    }
    plain_range<CMenus::CTheme>::pop_front(&r.super_plain_range<CMenus::CTheme>);
  } while( true );
}

Assistant:

void CMenus::RenderThemeSelection(CUIRect MainView, bool Header)
{
	static CListBox s_ListBox;

	if(m_lThemes.size() == 0) // not loaded yet
	{
		if(!Config()->m_ClShowMenuMap)
			str_copy(Config()->m_ClMenuMap, "", sizeof(Config()->m_ClMenuMap)); // cl_menu_map otherwise resets to default on loading
		m_lThemes.add(CTheme("", false, false)); // no theme
		m_lThemes.add(CTheme("auto", false, false)); // auto theme
		Storage()->ListDirectory(IStorage::TYPE_ALL, "ui/themes", ThemeScan, (CMenus*)this);
		Storage()->ListDirectory(IStorage::TYPE_ALL, "ui/themes", ThemeIconScan, (CMenus*)this);
	}

	int SelectedTheme = -1;
	for(int i = 0; i < m_lThemes.size(); i++)
		if(str_comp(m_lThemes[i].m_Name, Config()->m_ClMenuMap) == 0)
		{
			SelectedTheme = i;
			break;
		}
	const int OldSelected = SelectedTheme;

	if(Header)
		s_ListBox.DoHeader(&MainView, Localize("Theme"), UI()->GetListHeaderHeight());

	bool IsActive = m_ActiveListBox == ACTLB_THEME;
	s_ListBox.DoStart(20.0f, m_lThemes.size(), 1, 3, SelectedTheme, Header?0:&MainView, Header, &IsActive);

	for(sorted_array<CTheme>::range r = m_lThemes.all(); !r.empty(); r.pop_front())
	{
		const CTheme& Theme = r.front();
		CListboxItem Item = s_ListBox.DoNextItem(&Theme, SelectedTheme == (&Theme-m_lThemes.base_ptr()), &IsActive);
		if(IsActive)
			m_ActiveListBox = ACTLB_THEME;

		if(!Item.m_Visible)
			continue;

		CUIRect Icon;
		Item.m_Rect.VSplitLeft(Item.m_Rect.h*2.0f, &Icon, &Item.m_Rect);

		// draw icon if it exists
		if(Theme.m_IconTexture.IsValid())
		{
			Icon.VMargin(6.0f, &Icon);
			Icon.HMargin(3.0f, &Icon);
			Graphics()->TextureSet(Theme.m_IconTexture);
			Graphics()->QuadsBegin();
			Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
			IGraphics::CQuadItem QuadItem(Icon.x, Icon.y, Icon.w, Icon.h);
			Graphics()->QuadsDrawTL(&QuadItem, 1);
			Graphics()->QuadsEnd();
		}

		char aName[128];
		if(!Theme.m_Name[0])
			str_copy(aName, "(none)", sizeof(aName));
		else if(str_comp(Theme.m_Name, "auto") == 0)
			str_copy(aName, "(automatic)", sizeof(aName));
		else if(Theme.m_HasDay && Theme.m_HasNight)
			str_format(aName, sizeof(aName), "%s", Theme.m_Name.cstr());
		else if(Theme.m_HasDay && !Theme.m_HasNight)
			str_format(aName, sizeof(aName), "%s (day)", Theme.m_Name.cstr());
		else if(!Theme.m_HasDay && Theme.m_HasNight)
			str_format(aName, sizeof(aName), "%s (night)", Theme.m_Name.cstr());
		else // generic
			str_format(aName, sizeof(aName), "%s", Theme.m_Name.cstr());

		UI()->DoLabelSelected(&Item.m_Rect, aName, Item.m_Selected, Item.m_Rect.h*CUI::ms_FontmodHeight*0.8f, TEXTALIGN_ML);
	}

	SelectedTheme = s_ListBox.DoEnd();

	if(OldSelected != SelectedTheme)
	{
		m_ActiveListBox = ACTLB_THEME;
		str_copy(Config()->m_ClMenuMap, m_lThemes[SelectedTheme].m_Name, sizeof(Config()->m_ClMenuMap));
		Config()->m_ClShowMenuMap = m_lThemes[SelectedTheme].m_Name[0] ? 1 : 0;
		m_pClient->m_pMapLayersBackGround->BackgroundMapUpdate();
	}
}